

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O3

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ChContactNSCrolling(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                    *this,ChContactContainer *mcontainer,ChContactable_1vars<6> *mobjA,
                   ChContactable_1vars<6> *mobjB,ChCollisionInfo *cinfo,ChMaterialCompositeNSC *mat)

{
  undefined1 auVar1 [32];
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::ChContactNSC
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             mcontainer,mobjA,mobjB,cinfo,mat);
  (this->super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
  super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
  _vptr_ChContactTuple = (_func_int **)&PTR__ChContactNSCrolling_00b13570;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.valid = false;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.disabled = false;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.redundant = false;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.broken = false;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.active = true;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.variables = (ChVariables *)0x0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b13a08;
  (this->Rx).rollingfriction = 0.0;
  (this->Rx).spinningfriction = 0.0;
  (this->Rx).constraint_U =
       (ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        *)0x0;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.valid = false;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.disabled = false;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.redundant = false;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.broken = false;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.active = true;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.variables = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b13ae8;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.valid = false;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.disabled = false;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.redundant = false;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.broken = false;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.active = true;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.variables = (ChVariables *)0x0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data
   + 0x28) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Rv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
   + 8) = 0.0;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b13ae8;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  (this->react_torque).m_data[0] = 0.0;
  (this->react_torque).m_data[1] = 0.0;
  (this->react_torque).m_data[2] = 0.0;
  (this->Rx).constraint_U = &this->Ru;
  (this->Rx).constraint_V = &this->Rv;
  (this->Rx).constraint_N =
       &(this->super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
        Nx;
  Reset(this,mobjA,mobjB,cinfo,mat);
  return;
}

Assistant:

ChContactNSCrolling(ChContactContainer* mcontainer,           ///< contact container
                        Ta* mobjA,                                ///< collidable object A
                        Tb* mobjB,                                ///< collidable object B
                        const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                        const ChMaterialCompositeNSC& mat         ///< composite material
                        )
        : ChContactNSC<Ta, Tb>(mcontainer, mobjA, mobjB, cinfo, mat) {
        Rx.SetRollingConstraintU(&this->Ru);
        Rx.SetRollingConstraintV(&this->Rv);
        Rx.SetNormalConstraint(&this->Nx);

        Reset(mobjA, mobjB, cinfo, mat);
    }